

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O3

ObjFunction * newFunction(void)

{
  ObjFunction *pOVar1;
  
  pOVar1 = (ObjFunction *)reallocate((void *)0x0,0,0x48);
  (pOVar1->obj).type = OBJ_FUNCTION;
  (pOVar1->obj).next = vm.objects;
  (pOVar1->obj).isMarked = false;
  vm.objects = (Obj *)pOVar1;
  pOVar1->arity = 0;
  pOVar1->upvalueCount = 0;
  pOVar1->name = (ObjString *)0x0;
  initChunk(&pOVar1->chunk);
  return pOVar1;
}

Assistant:

ObjFunction *newFunction() {
    ObjFunction *function = ALLOCATE_OBJ(ObjFunction, OBJ_FUNCTION);

    function->arity = 0;
    function->upvalueCount = 0;

    function->name = NULL;
    initChunk(&function->chunk);
    return function;
}